

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_wav_preinit(ma_dr_wav *pWav,ma_dr_wav_read_proc onRead,ma_dr_wav_seek_proc onSeek,
                           void *pReadSeekUserData,ma_allocation_callbacks *pAllocationCallbacks)

{
  code *pcVar1;
  code *pcVar2;
  code *pcVar3;
  ma_bool32 mVar4;
  void *pvVar5;
  
  mVar4 = 0;
  if (onSeek != (ma_dr_wav_seek_proc)0x0 &&
      (onRead != (ma_dr_wav_read_proc)0x0 && pWav != (ma_dr_wav *)0x0)) {
    mVar4 = 0;
    memset(&pWav->onWrite,0,0x188);
    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->pUserData = pReadSeekUserData;
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      pcVar1 = ma_dr_wav__malloc_default;
      pcVar2 = ma_dr_wav__realloc_default;
      pcVar3 = ma_dr_wav__free_default;
      pvVar5 = (void *)0x0;
    }
    else {
      pvVar5 = pAllocationCallbacks->pUserData;
      pcVar1 = pAllocationCallbacks->onMalloc;
      pcVar2 = pAllocationCallbacks->onRealloc;
      pcVar3 = pAllocationCallbacks->onFree;
    }
    (pWav->allocationCallbacks).pUserData = pvVar5;
    (pWav->allocationCallbacks).onMalloc = pcVar1;
    (pWav->allocationCallbacks).onRealloc = pcVar2;
    (pWav->allocationCallbacks).onFree = pcVar3;
    if (pcVar3 != (_func_void_void_ptr_void_ptr *)0x0) {
      mVar4 = (ma_bool32)
              (pcVar1 != (_func_void_ptr_size_t_void_ptr *)0x0 ||
              pcVar2 != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0);
    }
  }
  return mVar4;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_preinit(ma_dr_wav* pWav, ma_dr_wav_read_proc onRead, ma_dr_wav_seek_proc onSeek, void* pReadSeekUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onRead == NULL || onSeek == NULL) {
        return MA_FALSE;
    }
    MA_DR_WAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onRead    = onRead;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pReadSeekUserData;
    pWav->allocationCallbacks = ma_dr_wav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);
    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return MA_FALSE;
    }
    return MA_TRUE;
}